

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_group_begin(nk_context *ctx,char *title,nk_flags flags)

{
  uint uVar1;
  nk_window *win;
  nk_table *pnVar2;
  long lVar3;
  nk_hash name;
  int iVar4;
  nk_uint *x_offset;
  nk_uint *y_offset;
  nk_table *pnVar5;
  nk_uint in_ECX;
  ulong uVar6;
  long lVar7;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x566b,"int nk_group_begin(struct nk_context *, const char *, nk_flags)");
  }
  if (title == (char *)0x0) {
    __assert_fail("title",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x566c,"int nk_group_begin(struct nk_context *, const char *, nk_flags)");
  }
  win = ctx->current;
  if (win == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x566d,"int nk_group_begin(struct nk_context *, const char *, nk_flags)");
  }
  if (win->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x566e,"int nk_group_begin(struct nk_context *, const char *, nk_flags)");
  }
  if (*title == '\0') {
    lVar7 = 0;
  }
  else {
    lVar7 = 0;
    do {
      lVar3 = lVar7 + 1;
      lVar7 = lVar7 + 1;
    } while (title[lVar3] != '\0');
  }
  name = nk_murmur_hash(title,(int)lVar7,2);
  pnVar5 = win->tables;
  for (pnVar2 = pnVar5; pnVar2 != (nk_table *)0x0; pnVar2 = pnVar2->next) {
    uVar6 = (ulong)pnVar2->size;
    if (uVar6 != 0) {
      x_offset = pnVar2->values;
      do {
        if (x_offset[-0x3b] == name) {
          uVar1 = win->seq;
          pnVar2->seq = uVar1;
          goto LAB_0013a42c;
        }
        x_offset = x_offset + 1;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    in_ECX = (nk_uint)uVar6;
  }
  x_offset = nk_add_value(ctx,win,name,in_ECX);
  y_offset = nk_add_value(ctx,win,name + 1,in_ECX);
  *y_offset = 0;
  *x_offset = 0;
  goto LAB_0013a45e;
LAB_0013a42c:
  do {
    uVar6 = (ulong)pnVar5->size;
    if (uVar6 != 0) {
      y_offset = pnVar5->values;
      do {
        if (y_offset[-0x3b] == name + 1) {
          pnVar5->seq = uVar1;
          goto LAB_0013a45e;
        }
        y_offset = y_offset + 1;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    pnVar5 = pnVar5->next;
  } while (pnVar5 != (nk_table *)0x0);
  y_offset = (nk_uint *)0x0;
LAB_0013a45e:
  iVar4 = nk_group_scrolled_offset_begin(ctx,x_offset,y_offset,title,flags);
  return iVar4;
}

Assistant:

NK_API int
nk_group_begin(struct nk_context *ctx, const char *title, nk_flags flags)
{
    int title_len;
    nk_hash title_hash;
    struct nk_window *win;
    nk_uint *x_offset;
    nk_uint *y_offset;

    NK_ASSERT(ctx);
    NK_ASSERT(title);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !title)
        return 0;

    /* find persistent group scrollbar value */
    win = ctx->current;
    title_len = (int)nk_strlen(title);
    title_hash = nk_murmur_hash(title, (int)title_len, NK_PANEL_GROUP);
    x_offset = nk_find_value(win, title_hash);
    if (!x_offset) {
        x_offset = nk_add_value(ctx, win, title_hash, 0);
        y_offset = nk_add_value(ctx, win, title_hash+1, 0);

        NK_ASSERT(x_offset);
        NK_ASSERT(y_offset);
        if (!x_offset || !y_offset) return 0;
        *x_offset = *y_offset = 0;
    } else y_offset = nk_find_value(win, title_hash+1);
    return nk_group_scrolled_offset_begin(ctx, x_offset, y_offset, title, flags);
}